

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebug.cxx
# Opt level: O1

int testDebug(int argc,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  undefined1 in_CL;
  uint uVar7;
  string str;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_d8;
  bool local_b8;
  string local_b0;
  long *local_90;
  long local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  undefined8 uStack_38;
  
  if (argc == 1) {
    cm::anon_unknown_0::dbg_impl<bool>((char *)0x16,0x90ffab,&DAT_00000001,(bool)in_CL);
    paVar1 = &local_b0.field_2;
    local_b0.field_2._M_allocated_capacity = 0x4f4e5f454b414d43;
    local_b0.field_2._8_4_ = 0x4742445f;
    local_b0._M_string_length = 0xc;
    local_b0.field_2._M_local_buf[0xc] = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_d8,&local_b0);
    bVar3 = local_b8;
    lVar2 = (long)&local_d8._M_value + 0x10;
    if ((local_b8 == true) &&
       (local_b8 = false, local_d8._M_value._M_dataplus._M_p != (_Alloc_hider)lVar2)) {
      operator_delete((void *)local_d8._M_value._M_dataplus._M_p,local_d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar3 == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                 ,100);
      local_d8._0_1_ = 0x3a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)&local_d8,1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"4",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      plVar6 = (long *)std::ostream::operator<<(poVar5,4);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
    }
    local_b0.field_2._M_allocated_capacity = 0x4f4e5f454b414d43;
    local_b0.field_2._8_4_ = 0x4742445f;
    local_b0._M_string_length = 0xc;
    local_b0.field_2._M_local_buf[0xc] = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_d8,&local_b0);
    bVar3 = local_b8;
    if ((local_b8 == true) &&
       (local_b8 = false, local_d8._M_value._M_dataplus._M_p != (_Alloc_hider)lVar2)) {
      operator_delete((void *)local_d8._M_value._M_dataplus._M_p,local_d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar3 == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                 ,100);
      local_d8._0_1_ = 0x3a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)&local_d8,1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"1.",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      poVar5 = std::ostream::_M_insert<double>(1.0);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    local_b0.field_2._M_allocated_capacity = 0x4f4e5f454b414d43;
    local_b0.field_2._8_4_ = 0x4742445f;
    local_b0._M_string_length = 0xc;
    local_b0.field_2._M_local_buf[0xc] = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_d8,&local_b0);
    bVar3 = local_b8;
    if ((local_b8 == true) &&
       (local_b8 = false, local_d8._M_value._M_dataplus._M_p != (_Alloc_hider)lVar2)) {
      operator_delete((void *)local_d8._M_value._M_dataplus._M_p,local_d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar3 == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                 ,100);
      local_d8._0_1_ = 0x3a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)&local_d8,1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'c\'",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      local_d8._0_1_ = 99;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_d8,1);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    local_b0.field_2._M_allocated_capacity = 0x4f4e5f454b414d43;
    local_b0.field_2._8_4_ = 0x4742445f;
    local_b0._M_string_length = 0xc;
    local_b0.field_2._M_local_buf[0xc] = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_d8,&local_b0);
    bVar3 = local_b8;
    if ((local_b8 == true) &&
       (local_b8 = false, local_d8._M_value._M_dataplus._M_p != (_Alloc_hider)lVar2)) {
      operator_delete((void *)local_d8._M_value._M_dataplus._M_p,local_d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar3 == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                 ,100);
      local_d8._0_1_ = 0x3a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)&local_d8,1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"literal string\"",0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"literal string",0xe);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    local_d8._M_value._M_dataplus._M_p = (_Alloc_hider)lVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"literal string","");
    iVar4 = std::__cxx11::string::compare((char *)&local_d8);
    if (local_d8._M_value._M_dataplus._M_p != (_Alloc_hider)lVar2) {
      operator_delete((void *)local_d8._M_value._M_dataplus._M_p,local_d8._16_8_ + 1);
    }
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Failed to return std::string(\"literal string\") for CM_DBG(\"literal string\")",
                 0x4b);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
    }
    uVar7 = (uint)(iVar4 != 0);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"std string","");
    local_90 = (long *)&local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_70,local_68 + (long)local_70);
    local_b0.field_2._M_allocated_capacity = 0x4f4e5f454b414d43;
    local_b0.field_2._8_4_ = 0x4742445f;
    local_b0._M_string_length = 0xc;
    local_b0.field_2._M_local_buf[0xc] = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_d8,&local_b0);
    bVar3 = local_b8;
    if ((local_b8 == true) &&
       (local_b8 = false, local_d8._M_value._M_dataplus._M_p != (_Alloc_hider)lVar2)) {
      operator_delete((void *)local_d8._M_value._M_dataplus._M_p,local_d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar3 == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                 ,100);
      local_d8._0_1_ = 0x3a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)&local_d8,1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"str",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_90,local_88);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if (local_90 == (long *)&local_80) {
      uStack_38 = uStack_78;
      local_50 = &local_40;
    }
    else {
      local_50 = local_90;
    }
    local_40 = CONCAT71(uStack_7f,local_80);
    local_48 = local_88;
    local_88 = 0;
    local_80 = 0;
    local_90 = (long *)&local_80;
    iVar4 = std::__cxx11::string::compare((char *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_90 != (long *)&local_80) {
      operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    }
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to return \"std string\" for CM_DBG(str)",0x2d);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
      std::ostream::put('`');
      uVar7 = 1;
      std::ostream::flush();
    }
    cm::anon_unknown_0::dbg_impl<bool>
              (&DAT_0000001e,0x9067b7,(char *)(ulong)(local_68 == 0),(bool)in_CL);
    if (local_68 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to return false for CM_DBG(str.empty())",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
      std::ostream::put('`');
      uVar7 = 1;
      std::ostream::flush();
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Invalid arguments.\n",0x13);
    uVar7 = 0xffffffff;
  }
  return uVar7;
}

Assistant:

int testDebug(int argc, char** const /*argv*/)
{
  if (argc != 1) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  int retval = 0;
  check(CM_DBG(true), true);
  check(CM_DBG(4), 4);
  check(CM_DBG(1.), 1.);
  check(CM_DBG('c'), 'c');
  check(CM_DBG("literal string"), std::string("literal string"));

  std::string str = "std string";
  check(CM_DBG(str), "std string");
  check(CM_DBG(str.empty()), false);

  return retval;
}